

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftcolor.c
# Opt level: O1

FT_Error FT_Palette_Data_Get(FT_Face face,FT_Palette_Data *apalette_data)

{
  undefined8 uVar1;
  FT_Bitmap_Size *pFVar2;
  FT_CharMap *ppFVar3;
  
  if (face == (FT_Face)0x0) {
    return 0x23;
  }
  if (apalette_data != (FT_Palette_Data *)0x0) {
    if ((face->face_flags & 8) == 0) {
      apalette_data->palette_flags = (FT_UShort *)0x0;
      *(undefined8 *)&apalette_data->num_palette_entries = 0;
      *(undefined8 *)apalette_data = 0;
      apalette_data->palette_name_ids = (FT_UShort *)0x0;
      apalette_data->palette_entry_name_ids = (FT_UShort *)0x0;
    }
    else {
      apalette_data->palette_entry_name_ids = (FT_UShort *)face[4].generic.data;
      uVar1 = *(undefined8 *)&face[4].num_fixed_sizes;
      pFVar2 = face[4].available_sizes;
      ppFVar3 = face[4].charmaps;
      apalette_data->palette_flags = *(FT_UShort **)&face[4].num_charmaps;
      *(FT_CharMap **)&apalette_data->num_palette_entries = ppFVar3;
      *(undefined8 *)apalette_data = uVar1;
      apalette_data->palette_name_ids = (FT_UShort *)pFVar2;
    }
    return 0;
  }
  return 6;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Palette_Data_Get( FT_Face           face,
                       FT_Palette_Data  *apalette_data )
  {
    if ( !face )
      return FT_THROW( Invalid_Face_Handle );
    if ( !apalette_data)
      return FT_THROW( Invalid_Argument );

    if ( FT_IS_SFNT( face ) )
      *apalette_data = ( (TT_Face)face )->palette_data;
    else
      *apalette_data = null_palette_data;

    return FT_Err_Ok;
  }